

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arch_memory_mapping.c
# Opt level: O1

void walk_pde(MemoryMappingList *list,AddressSpace *as,hwaddr pde_start_addr,int32_t a20_mask,
             target_ulong start_line_addr)

{
  _Bool _Var1;
  uint64_t uVar2;
  ulong virt_addr;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)a20_mask;
  lVar3 = 0;
  do {
    uVar2 = address_space_ldq_x86_64
                      ((uc_struct_conflict *)as->uc,as,pde_start_addr + lVar3 * 8 & uVar6,
                       (MemTxAttrs)0x1,(MemTxResult *)0x0);
    if ((uVar2 & 1) != 0) {
      virt_addr = lVar3 << 0x15 | start_line_addr;
      if ((char)uVar2 < '\0') {
        _Var1 = cpu_physical_memory_is_io_x86_64(as,uVar2 & 0x7fffffffffe00000);
        if (!_Var1) {
          memory_mapping_list_add_merge_sorted_x86_64
                    (list,uVar2 & 0x7fffffffffe00000,virt_addr,0x200000);
        }
      }
      else {
        uVar5 = uVar2 & uVar6 & 0xffffffffff000;
        uVar4 = 0;
        do {
          uVar2 = address_space_ldq_x86_64
                            ((uc_struct_conflict *)as->uc,as,uVar5 & uVar6,(MemTxAttrs)0x1,
                             (MemTxResult *)0x0);
          if ((uVar2 & 1) != 0) {
            _Var1 = cpu_physical_memory_is_io_x86_64(as,uVar2 & 0x7ffffffffffff000);
            if (!_Var1) {
              memory_mapping_list_add_merge_sorted_x86_64
                        (list,uVar2 & 0x7ffffffffffff000,uVar4 | virt_addr,0x1000);
            }
          }
          uVar5 = uVar5 + 8;
          uVar4 = uVar4 + 0x1000;
        } while (uVar4 != 0x200000);
      }
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x200);
  return;
}

Assistant:

static void walk_pde(MemoryMappingList *list, AddressSpace *as,
                     hwaddr pde_start_addr,
                     int32_t a20_mask, target_ulong start_line_addr)
{
    hwaddr pde_addr, pte_start_addr, start_paddr;
    uint64_t pde;
    target_ulong line_addr, start_vaddr;
    int i;

    for (i = 0; i < 512; i++) {
        pde_addr = (pde_start_addr + i * 8) & a20_mask;
#ifdef UNICORN_ARCH_POSTFIX
        pde = glue(address_space_ldq, UNICORN_ARCH_POSTFIX)(as->uc, as, pde_addr, MEMTXATTRS_UNSPECIFIED, NULL);
#else
        pde = address_space_ldq(as->uc, as, pde_addr, MEMTXATTRS_UNSPECIFIED, NULL);
#endif
        if (!(pde & PG_PRESENT_MASK)) {
            /* not present */
            continue;
        }

        line_addr = start_line_addr | ((i & 0x1ff) << 21);
        if (pde & PG_PSE_MASK) {
            /* 2 MB page */
            start_paddr = (pde & ~0x1fffff) & ~(0x1ULL << 63);
            if (cpu_physical_memory_is_io(as, start_paddr)) {
                /* I/O region */
                continue;
            }
            start_vaddr = line_addr;
            memory_mapping_list_add_merge_sorted(list, start_paddr,
                                                 start_vaddr, 1 << 21);
            continue;
        }

        pte_start_addr = (pde & PLM4_ADDR_MASK) & a20_mask;
        walk_pte(list, as, pte_start_addr, a20_mask, line_addr);
    }
}